

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

int reportProcessingInstruction(XML_Parser parser,ENCODING *enc,char *start,char *end)

{
  long *plVar1;
  int iVar2;
  XML_Char *pXVar3;
  char *pcVar4;
  XML_Char *s;
  long *plVar5;
  long *plVar6;
  
  if (*(long *)((long)parser + 0x80) == 0) {
    if (*(long *)((long)parser + 0xa0) == 0) {
      return 1;
    }
    reportDefault(parser,enc,start,end);
    return 1;
  }
  pcVar4 = start + (long)enc->minBytesPerChar * 2;
  iVar2 = (*enc->nameLength)(enc,pcVar4);
  pXVar3 = poolStoreString((STRING_POOL *)((long)parser + 0x418),enc,pcVar4,pcVar4 + iVar2);
  if (pXVar3 == (XML_Char *)0x0) {
    return 0;
  }
  *(undefined8 *)((long)parser + 0x438) = *(undefined8 *)((long)parser + 0x430);
  pcVar4 = (*enc->skipS)(enc,pcVar4 + iVar2);
  s = poolStoreString((STRING_POOL *)((long)parser + 0x418),enc,pcVar4,
                      end + (long)enc->minBytesPerChar * -2);
  if (s == (XML_Char *)0x0) {
    return 0;
  }
  normalizeLines(s);
  (**(code **)((long)parser + 0x80))(*(undefined8 *)((long)parser + 8),pXVar3,s);
  plVar6 = *(long **)((long)parser + 0x418);
  if (*(long **)((long)parser + 0x420) != (long *)0x0) {
    plVar1 = plVar6;
    plVar5 = *(long **)((long)parser + 0x420);
    if (plVar6 == (long *)0x0) goto LAB_004d5a9e;
    do {
      plVar6 = plVar1;
      plVar1 = (long *)*plVar6;
      *plVar6 = (long)plVar5;
      plVar5 = plVar6;
    } while (plVar1 != (long *)0x0);
  }
  *(long **)((long)parser + 0x420) = plVar6;
LAB_004d5a9e:
  *(undefined8 *)((long)parser + 0x418) = 0;
  *(undefined8 *)((long)parser + 0x428) = 0;
  *(undefined8 *)((long)parser + 0x430) = 0;
  *(undefined8 *)((long)parser + 0x438) = 0;
  return 1;
}

Assistant:

static int
reportProcessingInstruction(XML_Parser parser, const ENCODING *enc, const char *start, const char *end)
{
  const XML_Char *target;
  XML_Char *data;
  const char *tem;
  if (!processingInstructionHandler) {
    if (defaultHandler)
      reportDefault(parser, enc, start, end);
    return 1;
  }
  start += enc->minBytesPerChar * 2;
  tem = start + XmlNameLength(enc, start);
  target = poolStoreString(&tempPool, enc, start, tem);
  if (!target)
    return 0;
  poolFinish(&tempPool);
  data = poolStoreString(&tempPool, enc,
                        XmlSkipS(enc, tem),
                        end - enc->minBytesPerChar*2);
  if (!data)
    return 0;
  normalizeLines(data);
  processingInstructionHandler(handlerArg, target, data);
  poolClear(&tempPool);
  return 1;
}